

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O0

void mbedtls_x509_crl_free(mbedtls_x509_crl *crl)

{
  mbedtls_x509_crl **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_x509_crl_entry *pmVar3;
  mbedtls_x509_crl *pmVar4;
  mbedtls_x509_crl_entry *entry_prv;
  mbedtls_x509_crl_entry *entry_cur;
  mbedtls_x509_name *name_prv;
  mbedtls_x509_name *name_cur;
  mbedtls_x509_crl *crl_prv;
  mbedtls_x509_crl *crl_cur;
  mbedtls_x509_crl *crl_local;
  
  pmVar4 = crl;
  if (crl != (mbedtls_x509_crl *)0x0) {
    do {
      crl_prv = pmVar4;
      free(crl_prv->sig_opts);
      name_prv = (crl_prv->issuer).next;
      while (name_prv != (mbedtls_x509_name *)0x0) {
        pmVar2 = name_prv->next;
        mbedtls_zeroize(name_prv,0x40);
        free(name_prv);
        name_prv = pmVar2;
      }
      entry_prv = (crl_prv->entry).next;
      while (entry_prv != (mbedtls_x509_crl_entry *)0x0) {
        pmVar3 = entry_prv->next;
        mbedtls_zeroize(entry_prv,0x68);
        free(entry_prv);
        entry_prv = pmVar3;
      }
      if ((crl_prv->raw).p != (uchar *)0x0) {
        mbedtls_zeroize((crl_prv->raw).p,(crl_prv->raw).len);
        free((crl_prv->raw).p);
      }
      ppmVar1 = &crl_prv->next;
      crl_prv = crl;
      pmVar4 = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crl *)0x0);
    do {
      pmVar4 = crl_prv->next;
      mbedtls_zeroize(crl_prv,0x1a0);
      if (crl_prv != crl) {
        free(crl_prv);
      }
      crl_prv = pmVar4;
    } while (pmVar4 != (mbedtls_x509_crl *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crl_free( mbedtls_x509_crl *crl )
{
    mbedtls_x509_crl *crl_cur = crl;
    mbedtls_x509_crl *crl_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_crl_entry *entry_cur;
    mbedtls_x509_crl_entry *entry_prv;

    if( crl == NULL )
        return;

    do
    {
#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( crl_cur->sig_opts );
#endif

        name_cur = crl_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        entry_cur = crl_cur->entry.next;
        while( entry_cur != NULL )
        {
            entry_prv = entry_cur;
            entry_cur = entry_cur->next;
            mbedtls_zeroize( entry_prv, sizeof( mbedtls_x509_crl_entry ) );
            mbedtls_free( entry_prv );
        }

        if( crl_cur->raw.p != NULL )
        {
            mbedtls_zeroize( crl_cur->raw.p, crl_cur->raw.len );
            mbedtls_free( crl_cur->raw.p );
        }

        crl_cur = crl_cur->next;
    }
    while( crl_cur != NULL );

    crl_cur = crl;
    do
    {
        crl_prv = crl_cur;
        crl_cur = crl_cur->next;

        mbedtls_zeroize( crl_prv, sizeof( mbedtls_x509_crl ) );
        if( crl_prv != crl )
            mbedtls_free( crl_prv );
    }
    while( crl_cur != NULL );
}